

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O2

RC __thiscall QL_NodeSel::SetUpNode(QL_NodeSel *this,int numConds)

{
  undefined8 *puVar1;
  uint uVar2;
  RC RVar3;
  int *piVar4;
  Cond *pCVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  int *attrListPtr;
  int *local_20;
  
  RVar3 = QL_Node::GetAttrList(this->prevNode,&local_20,&(this->super_QL_Node).attrsInRecSize);
  if (RVar3 == 0) {
    uVar2 = (this->super_QL_Node).attrsInRecSize;
    piVar4 = (int *)malloc((long)(int)uVar2 << 2);
    (this->super_QL_Node).attrsInRec = piVar4;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      piVar4[uVar8] = local_20[uVar8];
    }
    pCVar5 = (Cond *)malloc((long)numConds * 0x30);
    (this->super_QL_Node).condList = pCVar5;
    lVar6 = 0;
    uVar8 = 0;
    if (0 < numConds) {
      uVar8 = (ulong)(uint)numConds;
    }
    for (; uVar8 * 0x30 - lVar6 != 0; lVar6 = lVar6 + 0x30) {
      pCVar5 = (this->super_QL_Node).condList;
      *(undefined4 *)((long)&pCVar5->offset1 + lVar6) = 0;
      *(undefined8 *)((long)&pCVar5->comparator + lVar6) = 0;
      (&pCVar5->isValue)[lVar6] = true;
      puVar1 = (undefined8 *)((long)&pCVar5->data + lVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pCVar5->length2 + lVar6) = 0;
    }
    piVar4 = (int *)malloc((long)numConds << 2);
    (this->super_QL_Node).condsInNode = piVar4;
    piVar4[0] = 0;
    piVar4[1] = 0;
    QL_Node::GetTupleLength(this->prevNode,&(this->super_QL_Node).tupleLength);
    pcVar7 = (char *)malloc((long)(this->super_QL_Node).tupleLength);
    this->buffer = pcVar7;
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    (this->super_QL_Node).listsInitialized = true;
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

RC QL_NodeSel::SetUpNode(int numConds){
  RC rc = 0;
  int *attrListPtr;
  if((rc = prevNode.GetAttrList(attrListPtr, attrsInRecSize)))
    return (rc);
  attrsInRec = (int *)malloc(attrsInRecSize*sizeof(int));
  for(int i = 0;  i < attrsInRecSize; i++){
    attrsInRec[i] = attrListPtr[i];
  }

  // allot space for these conditions
  condList = (Cond *)malloc(numConds * sizeof(Cond));
  for(int i= 0; i < numConds; i++){
    condList[i] = {0, NULL, true, NULL, 0, 0, INT};
  }
  condsInNode = (int*)malloc(numConds * sizeof(int));
  memset((void*)condsInNode, 0, sizeof(condsInNode));

  prevNode.GetTupleLength(tupleLength);
  buffer = (char *)malloc(tupleLength); // set up buffer
  memset((void*)buffer, 0, sizeof(buffer));
  listsInitialized = true;
  return (0);
}